

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

void __thiscall TadsListenerThread::~TadsListenerThread(TadsListenerThread *this)

{
  OS_Thread *in_RDI;
  TadsServerThread *tnxt;
  TadsServerThread *tcur;
  OS_Event *local_10;
  
  (in_RDI->super_CVmWeakRefable).super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsListenerThread_0042c0d8;
  (in_RDI->super_OS_Waitable)._vptr_OS_Waitable = (_func_int **)&DAT_0042c110;
  if (in_RDI[1].super_CVmWeakRefable.weakref != (CVmWeakRef *)0x0) {
    CVmRefCntObj::release_ref((CVmRefCntObj *)in_RDI);
  }
  CVmRefCntObj::release_ref((CVmRefCntObj *)in_RDI);
  CVmRefCntObj::release_ref((CVmRefCntObj *)in_RDI);
  CVmRefCntObj::release_ref((CVmRefCntObj *)in_RDI);
  lib_free_str((char *)0x25e81a);
  lib_free_str((char *)0x25e82a);
  local_10 = in_RDI[1].done_evt;
  while (local_10 != (OS_Event *)0x0) {
    local_10 = *(OS_Event **)((long)&local_10->mutex + 8);
    CVmWeakRefable::release_ref(&in_RDI->super_CVmWeakRefable);
  }
  OS_Thread::~OS_Thread(in_RDI);
  return;
}

Assistant:

TadsListenerThread::~TadsListenerThread()
{
    /* release our port, if we have one */
    if (port != 0)
        port->release_ref();
    
    /* release our quit event and shutdown event */
    quit_evt->release_ref();
    shutdown_evt->release_ref();
    
    /* release our mutex */
    mutex->release_ref();
    
    /* free the error message string */
    lib_free_str(errmsg);

    /* free the password string */
    lib_free_str(password);
    
    /* 
     *   Release all of our server threads.  Note that we don't need to
     *   protect against concurrent access here because we know that no one
     *   has a reference to this object any longer - it's the only way we can
     *   be deleted.  
     */
    TadsServerThread *tcur, *tnxt;
    for (tcur = servers ; tcur != 0 ; tcur = tnxt)
    {
        /* remember the next one, and release this one */
        tnxt = tcur->next_server;
        tcur->release_ref();
    }
}